

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<tcu::Vector<float,_4>_>::doExecute
          (VariableStatement<tcu::Vector<float,_4>_> *this,EvalContext *ctx)

{
  Environment *this_00;
  Variable<tcu::Vector<float,_4>_> *variable;
  Expr<tcu::Vector<float,_4>_> *pEVar1;
  undefined7 uVar2;
  IVal *pIVar3;
  long lVar4;
  IVal *pIVar5;
  byte bVar6;
  IVal local_80;
  
  bVar6 = 0;
  if (this->m_isDeclaration == true) {
    this_00 = ctx->env;
    variable = (this->m_variable).
               super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
               .m_ptr;
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Vector<float,_4>_>.
             super_ExprPBase<tcu::Vector<float,_4>_>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>.
             m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&local_80,pEVar1,ctx);
    Environment::bind<tcu::Vector<float,4>>(this_00,variable,&local_80);
  }
  else {
    pEVar1 = (this->m_value).super_ContainerExprPBase<tcu::Vector<float,_4>_>.
             super_ExprPBase<tcu::Vector<float,_4>_>.
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Vector<float,_4>_>_>.
             m_ptr;
    (*(pEVar1->super_ExprBase)._vptr_ExprBase[4])(&local_80,pEVar1,ctx);
    pIVar3 = Environment::lookup<tcu::Vector<float,4>>
                       (ctx->env,(this->m_variable).
                                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Vector<float,_4>_>_>
                                 .m_ptr);
    pIVar5 = &local_80;
    for (lVar4 = 0xc; lVar4 != 0; lVar4 = lVar4 + -1) {
      uVar2 = *(undefined7 *)&pIVar5->m_data[0].field_0x1;
      pIVar3->m_data[0].m_hasNaN = pIVar5->m_data[0].m_hasNaN;
      *(undefined7 *)&pIVar3->m_data[0].field_0x1 = uVar2;
      pIVar5 = (IVal *)((long)pIVar5 + ((ulong)bVar6 * -2 + 1) * 8);
      pIVar3 = (IVal *)((long)pIVar3 + ((ulong)bVar6 * -2 + 1) * 8);
    }
  }
  return;
}

Assistant:

void			doExecute			(EvalContext& ctx)						const
	{
		if (m_isDeclaration)
			ctx.env.bind(*m_variable, m_value->evaluate(ctx));
		else
			ctx.env.lookup(*m_variable) = m_value->evaluate(ctx);
	}